

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O0

void __thiscall
CStringKMerFactory128::create_kmers
          (CStringKMerFactory128 *this,
          vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers,char *s)

{
  unsigned___int128 *in_RDX;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *in_RSI;
  byte *in_RDI;
  int64_t *unaff_retaddr;
  uint64_t p;
  long local_20;
  
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  local_20 = 0;
  while (*(char *)((long)in_RDX + local_20) != '\0') {
    KMerFactory128::fillKBuf
              (&this->super_KMerFactory128,mers._7_1_,(__uint128_t *)s,(__uint128_t *)p,
               unaff_retaddr);
    local_20 = local_20 + 1;
    if ((long)(ulong)*in_RDI <= *(long *)(in_RDI + 8)) {
      if (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x18) ||
          *(ulong *)(in_RDI + 0x28) - *(ulong *)(in_RDI + 0x18) <
          (ulong)(*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x10))) {
        std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
        emplace_back<unsigned__int128&>(in_RSI,in_RDX);
      }
      else {
        std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
        emplace_back<unsigned__int128&>(in_RSI,in_RDX);
      }
    }
  }
  return;
}

Assistant:

const void create_kmers(std::vector<__uint128_t> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer);
                }
            }
        }
    }